

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  char cVar1;
  uint8_t *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ptls_key_exchange_context_t *ppVar7;
  undefined8 uVar8;
  int32_t v;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  undefined8 in_RAX;
  uint uVar12;
  uint8_t *msglen;
  ptls_message_emitter_t *emitter_00;
  void *get_sni_arg;
  int includes_appdata;
  ptls_iovec_t message_00;
  int got_certs;
  
  got_certs = (int)((ulong)in_RAX >> 0x20);
  msglen = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar12 = tls->state - PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  if (8 < uVar12) {
switchD_0010bf8d_caseD_a:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x167b,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar1 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_0010bf8d::switchdataD_001210c0 +
       (long)(int)(&switchD_0010bf8d::switchdataD_001210c0)[uVar12];
  switch(tls->state) {
  default:
    if (is_end_of_record != 0 && cVar1 == '\x01') {
      v = server_handle_hello(tls,emitter,message,properties);
      goto LAB_0010c11a;
    }
    goto LAB_0010c053;
  case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    goto switchD_0010bf8d_caseD_a;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (cVar1 == '\v') {
      v = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                             msglen + (long)&emitter_00->buf,&got_certs);
      if (v != 0) goto LAB_0010c11a;
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)msglen,0);
      tls->state = (uint)(got_certs == 0) * 2 + PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
LAB_0010c144:
      v = 0x202;
      goto LAB_0010c11a;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (cVar1 == '\x0f') {
      v = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
      if (v != 0) goto LAB_0010c11a;
LAB_0010c13c:
      tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
      goto LAB_0010c144;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0xb8 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x1662,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (cVar1 == '\x05') {
      v = commission_handshake_secret(tls);
      if (v != 0) goto LAB_0010c11a;
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)msglen,0);
      goto LAB_0010c13c;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if (is_end_of_record != 0 && cVar1 == '\x14') {
      v = verify_finished(tls,message);
      if (v == 0) {
        puVar2 = (tls->field_19).client.legacy_session_id.base;
        sVar3 = (tls->field_19).client.legacy_session_id.len;
        uVar4 = *(undefined8 *)((long)&tls->field_19 + 0x10);
        uVar5 = *(undefined8 *)((long)&tls->field_19 + 0x18);
        uVar6 = *(undefined8 *)((long)&tls->field_19 + 0x28);
        ppVar7 = (tls->field_19).client.key_share_ctx;
        uVar8 = *(undefined8 *)((long)&tls->field_19 + 0x38);
        *(undefined8 *)((tls->traffic_protection).dec.secret + 0x20) =
             *(undefined8 *)((long)&tls->field_19 + 0x20);
        *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar6;
        *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x30) = ppVar7;
        *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar8;
        *(uint8_t **)(tls->traffic_protection).dec.secret = puVar2;
        *(size_t *)((tls->traffic_protection).dec.secret + 8) = sVar3;
        *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar4;
        *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar5;
        (*ptls_clear_memory)(&tls->field_19,0x40);
        v = setup_traffic_protection(tls,0,(char *)0x0,3,0,0);
        if (v == 0) {
          ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)msglen,0);
          tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
          v = 0;
        }
      }
      goto LAB_0010c11a;
    }
LAB_0010c053:
    v = 0x28;
    goto LAB_0010c11a;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    if (cVar1 == '\x18') {
      message_00.base = msglen;
      v = handle_key_update(tls,emitter_00,message_00);
      goto LAB_0010c11a;
    }
  }
  v = 10;
LAB_0010c11a:
  uVar9 = ptls_log_point_maybe_active(&handle_server_handshake_message::logpoint);
  if (uVar9 != 0) {
    uVar10 = ptls_log_conn_maybe_active(&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
    if ((uVar10 & uVar9) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&handle_server_handshake_message::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        ptls_log__do_push_element_unsigned32(",\"message\":",0xb,(uint)*(byte *)&emitter_00->buf);
        ptls_log__do_push_element_unsigned64(",\"len\":",7,(uint64_t)(msglen + -4));
        ptls_log__do_push_element_signed32(",\"result\":",10,v);
        iVar11 = ptls_log__do_write_end
                           (&handle_server_handshake_message::logpoint,&tls->log_state,
                            ptls_get_server_name,tls,includes_appdata);
        includes_appdata = 1;
      } while (iVar11 != 0);
    }
  }
  return v;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);
    PTLS_LOG_CONN(receive_message, tls, {
        PTLS_LOG_ELEMENT_UNSIGNED(message, message.base[0]);
        PTLS_LOG_ELEMENT_UNSIGNED(len, message.len - PTLS_HANDSHAKE_HEADER_SIZE);
        PTLS_LOG_ELEMENT_SIGNED(result, ret);
    });

    return ret;
}